

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_common.cpp
# Opt level: O1

ssize_t __thiscall pstore::brokerface::writer::write(writer *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *piVar4;
  undefined4 in_register_00000034;
  uint uVar5;
  char local_44;
  timespec local_40;
  
  uVar1 = this->max_retries_;
  uVar5 = 0;
  do {
    if ((this->update_cb_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
      goto LAB_00164c4e;
    }
    (*(this->update_cb_)._M_invoker)((_Any_data *)&this->update_cb_);
    iVar3 = (*this->_vptr_writer[2])(this,CONCAT44(in_register_00000034,__fd));
    piVar4 = (int *)CONCAT44(extraout_var,iVar3);
    if ((char)iVar3 != '\0') break;
    uVar2 = (this->retry_timeout_).__r;
    if (0 < (long)uVar2) {
      local_40.tv_sec = uVar2 / 1000;
      local_40.tv_nsec = (uVar2 % 1000) * 1000000;
      do {
        iVar3 = nanosleep(&local_40,&local_40);
        piVar4 = (int *)CONCAT44(extraout_var_00,iVar3);
        if (iVar3 != -1) break;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
    }
    uVar5 = uVar5 + 1;
  } while ((uVar1 == 0xffffffff) || (uVar5 <= this->max_retries_));
  if ((uVar1 == 0xffffffff) ||
     ((local_44 = (char)__buf, local_44 == '\0' || (uVar5 <= this->max_retries_)))) {
    return (ssize_t)piVar4;
  }
LAB_00164c4e:
  raise<pstore::error_code>(pipe_write_timeout);
}

Assistant:

void writer::write (message_type const & msg, bool const error_on_timeout) {
            auto tries = 0U;
            bool const infinite_tries = max_retries_ == infinite_retries;
            for (; infinite_tries || tries <= max_retries_; ++tries) {
                update_cb_ ();
                if (this->write_impl (msg)) {
                    break;
                }
                std::this_thread::sleep_for (retry_timeout_);
            }

            if (error_on_timeout && !infinite_tries && tries > max_retries_) {
                raise (::pstore::error_code::pipe_write_timeout);
            }
        }